

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8AllCertificatesSamePolicyTest1Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section8AllCertificatesSamePolicyTest1Subpart2
          (Section8AllCertificatesSamePolicyTest1Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section8AllCertificatesSamePolicyTest1Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~Section8AllCertificatesSamePolicyTest1Subpart2(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8AllCertificatesSamePolicyTest1Subpart2) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "ValidCertificatePathTest1EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.1";
  info.should_validate = true;
  info.SetInitialPolicySet("NIST-test-policy-1");
  info.SetInitialExplicitPolicy(true);

  this->RunTest(certs, crls, info);
}